

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

void __thiscall
dtc::fdt::property::property(property *this,input_buffer *structs,input_buffer *strings)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool *this_00;
  int iVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint8_t byte;
  uint32_t length;
  uint32_t name_offset;
  property_value v;
  input_buffer name_buffer;
  uchar local_e1;
  uint local_e0;
  uint local_dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *local_d0;
  undefined1 local_c8 [64];
  pointer local_88;
  iterator iStack_80;
  uchar *local_78;
  value_type local_70;
  input_buffer local_68;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  paVar1 = &(this->key).field_2;
  (this->key)._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = false;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  (this->labels)._M_h._M_buckets = &(this->labels)._M_h._M_single_bucket;
  (this->labels)._M_h._M_bucket_count = 1;
  (this->labels)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->labels)._M_h._M_element_count = 0;
  (this->labels)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->labels)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->labels)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = input_buffer::consume_binary<unsigned_int>(structs,&local_e0);
  if (bVar3) {
    bVar4 = input_buffer::consume_binary<unsigned_int>(structs,&local_dc);
  }
  this->valid = bVar4;
  if (bVar4 == false) {
    fdt::property();
  }
  else {
    input_buffer::buffer_from_offset(&local_68,strings,local_dc,0);
    this_00 = &this->valid;
    if (local_68.cursor < local_68.size) {
      input_buffer::parse_to_abi_cxx11_((string *)local_c8,&local_68,'\0');
      std::__cxx11::string::operator=((string *)this,(string *)local_c8);
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if (local_e0 != 0) {
        local_48 = 0;
        local_40 = 0;
        local_c8._0_8_ = local_c8 + 0x10;
        local_d8 = paVar1;
        local_d0 = &this->values;
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char*>((string *)local_c8,&local_40,&local_40);
        local_c8._32_8_ = local_c8 + 0x30;
        local_c8._40_8_ = 0;
        local_c8[0x30] = '\0';
        local_88 = (pointer)0x0;
        iStack_80._M_current = (uchar *)0x0;
        local_78 = (uchar *)0x0;
        local_70 = UNKNOWN;
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        if (local_e0 != 0) {
          uVar5 = 0;
          do {
            iVar2 = structs->cursor;
            if (structs->size <= iVar2) {
              fdt::property((fdt *)this_00);
              goto LAB_0012247c;
            }
            structs->cursor = iVar2 + 1;
            local_e1 = structs->buffer[iVar2];
            *this_00 = iVar2 < structs->size;
            if (iStack_80._M_current == local_78) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,iStack_80,
                         &local_e1);
            }
            else {
              *iStack_80._M_current = local_e1;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 < local_e0);
        }
        std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                  (local_d0,(value_type *)local_c8);
LAB_0012247c:
        if (local_88 != (pointer)0x0) {
          operator_delete(local_88,(long)local_78 - (long)local_88);
        }
        if ((undefined1 *)local_c8._32_8_ != local_c8 + 0x30) {
          operator_delete((void *)local_c8._32_8_,CONCAT71(local_c8._49_7_,local_c8[0x30]) + 1);
        }
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
      }
    }
    else {
      fprintf(_stderr,"Property name offset %u is past the end of the strings table\n",
              (ulong)local_dc);
      *this_00 = false;
    }
  }
  return;
}

Assistant:

property::property(input_buffer &structs, input_buffer &strings)
{
	uint32_t name_offset;
	uint32_t length;
	valid = structs.consume_binary(length) &&
		structs.consume_binary(name_offset);
	if (!valid)
	{
		fprintf(stderr, "Failed to read property\n");
		return;
	}
	// Find the name
	input_buffer name_buffer = strings.buffer_from_offset(name_offset);
	if (name_buffer.finished())
	{
		fprintf(stderr, "Property name offset %" PRIu32
			" is past the end of the strings table\n",
			name_offset);
		valid = false;
		return;
	}
	key = name_buffer.parse_to(0);

	// If we're empty, do not push anything as value.
	if (!length)
		return;

	// Read the value
	uint8_t byte;
	property_value v;
	for (uint32_t i=0 ; i<length ; i++)
	{
		if (!(valid = structs.consume_binary(byte)))
		{
			fprintf(stderr, "Failed to read property value\n");
			return;
		}
		v.byte_data.push_back(byte);
	}
	values.push_back(v);
}